

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void labelsize_cb(Fl_Value_Input *i,void *v)

{
  Fl_Widget_Type *this;
  bool bVar1;
  int iVar2;
  Fl_Fontsize FVar3;
  Fl_Widget_Type *q;
  Fl_Type **ppFVar4;
  
  if ((char *)v == "LOAD") {
    FVar3 = (current_widget->o->label_).size;
  }
  else {
    FVar3 = (Fl_Fontsize)(i->super_Fl_Valuator).value_;
    if (FVar3 < 1) {
      FVar3 = Fl_Widget_Type::default_size;
    }
    bVar1 = false;
    ppFVar4 = &Fl_Type::first;
    while (this = (Fl_Widget_Type *)*ppFVar4, this != (Fl_Widget_Type *)0x0) {
      if ((this->super_Fl_Type).selected != '\0') {
        iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this);
        if (iVar2 != 0) {
          (this->o->label_).size = FVar3;
          Fl_Widget_Type::redraw(this);
          bVar1 = true;
        }
      }
      ppFVar4 = &(this->super_Fl_Type).next;
    }
    if (bVar1) {
      set_modflag(1);
    }
  }
  Fl_Valuator::value(&i->super_Fl_Valuator,(double)FVar3);
  return;
}

Assistant:

void labelsize_cb(Fl_Value_Input* i, void *v) {
  int n;
  if (v == LOAD) {
    n = current_widget->o->labelsize();
  } else {
    int mod = 0;
    n = int(i->value());
    if (n <= 0) n = Fl_Widget_Type::default_size;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->o->labelsize(n);
	q->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
  i->value(n);
}